

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

int ecp_normalize_jac(mbedtls_ecp_group *grp,mbedtls_ecp_point *pt)

{
  mbedtls_mpi *X;
  int iVar1;
  int iVar2;
  mbedtls_mpi *X_00;
  mbedtls_mpi ZZi;
  mbedtls_mpi Zi;
  
  X = &pt->Z;
  iVar2 = 0;
  iVar1 = mbedtls_mpi_cmp_int(X,0);
  if (iVar1 != 0) {
    mbedtls_mpi_init(&Zi);
    mbedtls_mpi_init(&ZZi);
    iVar2 = mbedtls_mpi_inv_mod(&Zi,X,&grp->P);
    if (iVar2 == 0) {
      iVar2 = mbedtls_mpi_mul_mod(grp,&ZZi,&Zi,&Zi);
      if (iVar2 == 0) {
        iVar2 = mbedtls_mpi_mul_mod(grp,&pt->X,&pt->X,&ZZi);
        if (iVar2 == 0) {
          X_00 = &pt->Y;
          iVar2 = mbedtls_mpi_mul_mod(grp,X_00,X_00,&ZZi);
          if (iVar2 == 0) {
            iVar2 = mbedtls_mpi_mul_mod(grp,X_00,X_00,&Zi);
            if (iVar2 == 0) {
              iVar2 = mbedtls_mpi_lset(X,1);
            }
          }
        }
      }
    }
    mbedtls_mpi_free(&Zi);
    mbedtls_mpi_free(&ZZi);
  }
  return iVar2;
}

Assistant:

static int ecp_normalize_jac( const mbedtls_ecp_group *grp, mbedtls_ecp_point *pt )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi Zi, ZZi;

    if( mbedtls_mpi_cmp_int( &pt->Z, 0 ) == 0 )
        return( 0 );

#if defined(MBEDTLS_ECP_NORMALIZE_JAC_ALT)
    if( mbedtls_internal_ecp_grp_capable( grp ) )
        return( mbedtls_internal_ecp_normalize_jac( grp, pt ) );
#endif /* MBEDTLS_ECP_NORMALIZE_JAC_ALT */

    mbedtls_mpi_init( &Zi ); mbedtls_mpi_init( &ZZi );

    /*
     * X = X / Z^2  mod p
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( &Zi,      &pt->Z,     &grp->P ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &ZZi,     &Zi,        &Zi     ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &pt->X,   &pt->X,     &ZZi    ) );

    /*
     * Y = Y / Z^3  mod p
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &pt->Y,   &pt->Y,     &ZZi    ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &pt->Y,   &pt->Y,     &Zi     ) );

    /*
     * Z = 1
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &pt->Z, 1 ) );

cleanup:

    mbedtls_mpi_free( &Zi ); mbedtls_mpi_free( &ZZi );

    return( ret );
}